

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O0

Eci * libsgp4::SGP4::CalculateFinalPositionVelocity
                (Eci *__return_storage_ptr__,DateTime *dt,double e,double a,double omega,double xl,
                double xnode,double xinc,double xlcof,double aycof,double x3thm1,double x1mth2,
                double x7thm1,double cosio,double sinio)

{
  bool bVar1;
  bool bVar2;
  SatelliteException *pSVar3;
  DecayedException *this;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double __x;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 local_2a0 [8];
  Vector velocity;
  double zdot;
  double ydot;
  double xdot;
  Vector position;
  double z;
  double y;
  double x;
  double vz;
  double vy;
  double vx;
  double uz;
  double uy;
  double ux;
  double xmy;
  double xmx;
  double cosnok;
  double sinnok;
  double cosik;
  double sinik;
  double cosuk;
  double sinuk;
  double rfdotk;
  double rdotk;
  double xinck;
  double xnodek;
  double uk;
  double rk;
  double temp43;
  double temp42;
  double temp41;
  double cos2u;
  double sin2u;
  double u;
  double sinu;
  double cosu;
  double temp33;
  double betal;
  double temp32;
  double rfdot;
  double rdot;
  double temp31;
  double r;
  double pl;
  double temp21;
  double delta_epw;
  double fdot;
  double f;
  int i;
  bool kepler_running;
  double max_newton_naphson;
  double esine;
  double ecose;
  double cosepw;
  double sinepw;
  double epw;
  double capu;
  double elsq;
  double ayn;
  double xlt;
  double aynl;
  double xll;
  double temp11;
  double axn;
  double xn;
  double beta2;
  double aycof_local;
  double xlcof_local;
  double xinc_local;
  double xnode_local;
  double xl_local;
  double omega_local;
  double a_local;
  double e_local;
  DateTime *dt_local;
  
  dVar16 = kXKE;
  dVar4 = pow(a,1.5);
  dVar5 = cos(omega);
  dVar5 = e * dVar5;
  dVar6 = 1.0 / (a * (-e * e + 1.0));
  dVar7 = sin(omega);
  dVar7 = e * dVar7 + dVar6 * aycof;
  dVar8 = dVar5 * dVar5 + dVar7 * dVar7;
  if (1.0 <= dVar8) {
    pSVar3 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(pSVar3,"Error: (elsq >= 1.0)");
    __cxa_throw(pSVar3,&SatelliteException::typeinfo,SatelliteException::~SatelliteException);
  }
  dVar6 = fmod((xl + dVar6 * xlcof * dVar5) - xnode,6.283185307179586);
  cosepw = 0.0;
  ecose = 0.0;
  esine = 0.0;
  max_newton_naphson = 0.0;
  dVar9 = sqrt(dVar8);
  dVar9 = (double)((ulong)dVar9 & (ulong)DAT_00112540) * 1.25;
  bVar2 = true;
  f._0_4_ = 0;
  sinepw = dVar6;
  while( true ) {
    dVar17 = kXKE;
    bVar1 = false;
    if (f._0_4_ < 10) {
      bVar1 = bVar2;
    }
    if (!bVar1) break;
    cosepw = sin(sinepw);
    ecose = cos(sinepw);
    esine = dVar5 * ecose + dVar7 * cosepw;
    max_newton_naphson = dVar5 * cosepw + -(dVar7 * ecose);
    dVar17 = (dVar6 - sinepw) + max_newton_naphson;
    if (1e-12 <= (double)((ulong)dVar17 & (ulong)DAT_00112540)) {
      dVar10 = dVar17 / (1.0 - esine);
      if (f._0_4_ == 0) {
        temp21 = dVar9;
        if ((dVar10 <= dVar9) && (temp21 = dVar10, dVar10 < -dVar9)) {
          temp21 = -dVar9;
        }
      }
      else {
        temp21 = dVar17 / (max_newton_naphson * 0.5 * dVar10 + (1.0 - esine));
      }
      sinepw = temp21 + sinepw;
    }
    else {
      bVar2 = false;
    }
    f._0_4_ = f._0_4_ + 1;
  }
  dVar6 = a * (1.0 - dVar8);
  if (0.0 <= dVar6) {
    dVar10 = a * (1.0 - esine);
    dVar11 = 1.0 / dVar10;
    dVar12 = sqrt(a);
    dVar9 = kXKE;
    dVar13 = sqrt(dVar6);
    dVar8 = sqrt(1.0 - dVar8);
    dVar14 = 1.0 / (dVar8 + 1.0);
    __x = a * dVar11 * (dVar7 * max_newton_naphson * dVar14 + (ecose - dVar5));
    dVar5 = a * dVar11 * (-(dVar5 * max_newton_naphson) * dVar14 + (cosepw - dVar7));
    dVar15 = atan2(dVar5,__x);
    dVar5 = dVar5 * 2.0 * __x;
    dVar7 = __x * 2.0 * __x + -1.0;
    dVar14 = (1.0 / dVar6) * 0.000541308;
    dVar6 = dVar14 * (1.0 / dVar6);
    dVar8 = dVar10 * (-(dVar6 * 1.5 * dVar8) * x3thm1 + 1.0) + dVar14 * 0.5 * x1mth2 * dVar7;
    dVar15 = -(dVar6 * 0.25 * x7thm1) * dVar5 + dVar15;
    dVar10 = dVar6 * 1.5 * cosio * dVar5 + xnode;
    dVar6 = dVar6 * 1.5 * cosio * sinio * dVar7 + xinc;
    dVar5 = -((dVar16 / dVar4) * dVar14 * x1mth2) * dVar5 +
            dVar17 * dVar12 * max_newton_naphson * dVar11;
    dVar16 = (dVar16 / dVar4) * dVar14 * (x1mth2 * dVar7 + x3thm1 * 1.5) + dVar9 * dVar13 * dVar11;
    dVar4 = sin(dVar15);
    dVar7 = cos(dVar15);
    dVar9 = sin(dVar6);
    dVar6 = cos(dVar6);
    dVar17 = sin(dVar10);
    dVar10 = cos(dVar10);
    dVar11 = -dVar17 * dVar6 * dVar4 + dVar10 * dVar7;
    dVar12 = dVar10 * dVar6 * dVar4 + dVar17 * dVar7;
    position.w = dVar8 * dVar9 * dVar4 * 6378.135;
    Vector::Vector((Vector *)&xdot,dVar8 * dVar11 * 6378.135,dVar8 * dVar12 * 6378.135,position.w);
    velocity.w = ((dVar5 * dVar9 * dVar4 + dVar16 * dVar9 * dVar7) * 6378.135) / 60.0;
    Vector::Vector((Vector *)local_2a0,
                   ((dVar5 * dVar11 + dVar16 * (-dVar17 * dVar6 * dVar7 + -(dVar10 * dVar4))) *
                   6378.135) / 60.0,
                   ((dVar5 * dVar12 + dVar16 * (dVar10 * dVar6 * dVar7 + -(dVar17 * dVar4))) *
                   6378.135) / 60.0,velocity.w);
    if (1.0 <= dVar8) {
      Eci::Eci(__return_storage_ptr__,dt,(Vector *)&xdot,(Vector *)local_2a0);
      return __return_storage_ptr__;
    }
    this = (DecayedException *)__cxa_allocate_exception(0x58);
    DecayedException::DecayedException(this,dt,(Vector *)&xdot,(Vector *)local_2a0);
    __cxa_throw(this,&DecayedException::typeinfo,DecayedException::~DecayedException);
  }
  pSVar3 = (SatelliteException *)__cxa_allocate_exception(0x10);
  SatelliteException::SatelliteException(pSVar3,"Error: (pl < 0.0)");
  __cxa_throw(pSVar3,&SatelliteException::typeinfo,SatelliteException::~SatelliteException);
}

Assistant:

Eci SGP4::CalculateFinalPositionVelocity(
        const DateTime& dt,
        const double e,
        const double a,
        const double omega,
        const double xl,
        const double xnode,
        const double xinc,
        const double xlcof,
        const double aycof,
        const double x3thm1,
        const double x1mth2,
        const double x7thm1,
        const double cosio,
        const double sinio)
{
    const double beta2 = 1.0 - e * e;
    const double xn = kXKE / pow(a, 1.5);
    /*
     * long period periodics
     */
    const double axn = e * cos(omega);
    const double temp11 = 1.0 / (a * beta2);
    const double xll = temp11 * xlcof * axn;
    const double aynl = temp11 * aycof;
    const double xlt = xl + xll;
    const double ayn = e * sin(omega) + aynl;
    const double elsq = axn * axn + ayn * ayn;

    if (elsq >= 1.0)
    {
        throw SatelliteException("Error: (elsq >= 1.0)");
    }

    /*
     * solve keplers equation
     * - solve using Newton-Raphson root solving
     * - here capu is almost the mean anomoly
     * - initialise the eccentric anomaly term epw
     * - The fmod saves reduction of angle to +/-2pi in sin/cos() and prevents
     * convergence problems.
     */
    const double capu = fmod(xlt - xnode, kTWOPI);
    double epw = capu;

    double sinepw = 0.0;
    double cosepw = 0.0;
    double ecose = 0.0;
    double esine = 0.0;

    /*
     * sensibility check for N-R correction
     */
    const double max_newton_naphson = 1.25 * fabs(sqrt(elsq));

    bool kepler_running = true;

    for (int i = 0; i < 10 && kepler_running; i++)
    {
        sinepw = sin(epw);
        cosepw = cos(epw);
        ecose = axn * cosepw + ayn * sinepw;
        esine = axn * sinepw - ayn * cosepw;

        double f = capu - epw + esine;

        if (fabs(f) < 1.0e-12)
        {
            kepler_running = false;
        }
        else
        {
            /*
             * 1st order Newton-Raphson correction
             */
            const double fdot = 1.0 - ecose;
            double delta_epw = f / fdot;

            /*
             * 2nd order Newton-Raphson correction.
             * f / (fdot - 0.5 * d2f * f/fdot)
             */
            if (i == 0)
            {
                if (delta_epw > max_newton_naphson)
                {
                    delta_epw = max_newton_naphson;
                }
                else if (delta_epw < -max_newton_naphson)
                {
                    delta_epw = -max_newton_naphson;
                }
            }
            else
            {
                delta_epw = f / (fdot + 0.5 * esine * delta_epw);
            }

            /*
             * Newton-Raphson correction of -F/DF
             */
            epw += delta_epw;
        }
    }
    /*
     * short period preliminary quantities
     */
    const double temp21 = 1.0 - elsq;
    const double pl = a * temp21;

    if (pl < 0.0)
    {
        throw SatelliteException("Error: (pl < 0.0)");
    }

    const double r = a * (1.0 - ecose);
    const double temp31 = 1.0 / r;
    const double rdot = kXKE * sqrt(a) * esine * temp31;
    const double rfdot = kXKE * sqrt(pl) * temp31;
    const double temp32 = a * temp31;
    const double betal = sqrt(temp21);
    const double temp33 = 1.0 / (1.0 + betal);
    const double cosu = temp32 * (cosepw - axn + ayn * esine * temp33);
    const double sinu = temp32 * (sinepw - ayn - axn * esine * temp33);
    const double u = atan2(sinu, cosu);
    const double sin2u = 2.0 * sinu * cosu;
    const double cos2u = 2.0 * cosu * cosu - 1.0;

    /*
     * update for short periodics
     */
    const double temp41 = 1.0 / pl;
    const double temp42 = kCK2 * temp41;
    const double temp43 = temp42 * temp41;

    const double rk = r * (1.0 - 1.5 * temp43 * betal * x3thm1)
        + 0.5 * temp42 * x1mth2 * cos2u;
    const double uk = u - 0.25 * temp43 * x7thm1 * sin2u;
    const double xnodek = xnode + 1.5 * temp43 * cosio * sin2u;
    const double xinck = xinc + 1.5 * temp43 * cosio * sinio * cos2u;
    const double rdotk = rdot - xn * temp42 * x1mth2 * sin2u;
    const double rfdotk = rfdot + xn * temp42 * (x1mth2 * cos2u + 1.5 * x3thm1);

    /*
     * orientation vectors
     */
    const double sinuk = sin(uk);
    const double cosuk = cos(uk);
    const double sinik = sin(xinck);
    const double cosik = cos(xinck);
    const double sinnok = sin(xnodek);
    const double cosnok = cos(xnodek);
    const double xmx = -sinnok * cosik;
    const double xmy = cosnok * cosik;
    const double ux = xmx * sinuk + cosnok * cosuk;
    const double uy = xmy * sinuk + sinnok * cosuk;
    const double uz = sinik * sinuk;
    const double vx = xmx * cosuk - cosnok * sinuk;
    const double vy = xmy * cosuk - sinnok * sinuk;
    const double vz = sinik * cosuk;
    /*
     * position and velocity
     */
    const double x = rk * ux * kXKMPER;
    const double y = rk * uy * kXKMPER;
    const double z = rk * uz * kXKMPER;
    Vector position(x, y, z);
    const double xdot = (rdotk * ux + rfdotk * vx) * kXKMPER / 60.0;
    const double ydot = (rdotk * uy + rfdotk * vy) * kXKMPER / 60.0;
    const double zdot = (rdotk * uz + rfdotk * vz) * kXKMPER / 60.0;
    Vector velocity(xdot, ydot, zdot);

    if (rk < 1.0)
    {
        throw DecayedException(
                dt,
                position,
                velocity);
    }

    return Eci(dt, position, velocity);
}